

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qedidparser.cpp
# Opt level: O2

bool __thiscall QEdidParser::parse(QEdidParser *this,QByteArray *blob)

{
  undefined1 *puVar1;
  quint8 qVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  long lVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  char16_t *pcVar18;
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  char cVar23;
  int iVar24;
  qsizetype qVar25;
  Data *pDVar26;
  pointer puVar27;
  uint uVar28;
  ulong uVar29;
  char *pcVar30;
  difference_type __d;
  ulong uVar31;
  uint uVar32;
  QEdidParser *this_00;
  long lVar34;
  uint j;
  QList<QList<unsigned_short>_> *this_01;
  ulong uVar35;
  QEdidVendorId *__s1;
  quint8 *data;
  long in_FS_OFFSET;
  bool bVar36;
  qreal qVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [14];
  undefined1 auVar40 [14];
  undefined1 auVar41 [16];
  undefined1 auVar42 [14];
  undefined1 auVar43 [16];
  undefined1 auVar44 [14];
  QLatin1StringView latin1;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView local_2d8;
  QArrayDataPointer<char16_t> local_2c8;
  QArrayDataPointer<char16_t> local_2a8;
  QByteArrayView local_288;
  undefined1 *local_278;
  undefined1 *puStack_270;
  QArrayDataPointer<char16_t> local_268;
  QByteArrayView local_250;
  byte local_23b;
  byte local_23a;
  byte local_239;
  char buf [512];
  ulong uVar33;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar30 = (blob->d).ptr;
  uVar29 = (blob->d).size;
  if (pcVar30 == (char *)0x0) {
    pcVar30 = (char *)&QByteArray::_empty;
  }
  if (((uVar29 < 0x80) || (*pcVar30 != '\0')) || (pcVar30[1] != -1)) {
    bVar36 = false;
    goto LAB_005c1b0a;
  }
  local_23b = (byte)pcVar30[8] >> 2 & 0x1f | 0x40;
  local_23a = (byte)pcVar30[9] >> 5 | (pcVar30[8] & 3U) << 3 | 0x40;
  local_239 = pcVar30[9] & 0x1fU | 0x40;
  buf._0_8_ = (this->manufacturer).d.d;
  buf._8_8_ = (this->manufacturer).d.ptr;
  (this->manufacturer).d.d = (Data *)0x0;
  (this->manufacturer).d.ptr = (char16_t *)0x0;
  buf._16_8_ = (this->manufacturer).d.size;
  (this->manufacturer).d.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buf);
  uVar28 = *(uint *)(pcVar30 + 0xc);
  this_00 = (QEdidParser *)(ulong)uVar28;
  if (uVar28 == 0) {
    buf._0_8_ = (this->serialNumber).d.d;
    buf._8_8_ = (this->serialNumber).d.ptr;
    (this->serialNumber).d.d = (Data *)0x0;
    (this->serialNumber).d.ptr = (char16_t *)0x0;
    buf._16_8_ = (this->serialNumber).d.size;
    (this->serialNumber).d.size = 0;
  }
  else {
    QString::number((uint)buf,uVar28);
    pDVar26 = (this->serialNumber).d.d;
    pcVar18 = (this->serialNumber).d.ptr;
    (this->serialNumber).d.d = (Data *)buf._0_8_;
    (this->serialNumber).d.ptr = (char16_t *)buf._8_8_;
    qVar25 = (this->serialNumber).d.size;
    (this->serialNumber).d.size = buf._16_8_;
    buf._0_8_ = pDVar26;
    buf._8_8_ = pcVar18;
    buf._16_8_ = qVar25;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buf);
  data = (quint8 *)(pcVar30 + 0x3b);
  lVar34 = 4;
  while (bVar36 = lVar34 != 0, lVar34 = lVar34 + -1, bVar36) {
    if (((data[-5] == '\0') && (data[-4] == '\0')) && (data[-3] == '\0')) {
      qVar2 = data[-2];
      if (qVar2 == 0xff) {
        parseEdidString((QString *)buf,this_00,data);
        pDVar26 = (this->serialNumber).d.d;
        pcVar18 = (this->serialNumber).d.ptr;
        (this->serialNumber).d.d = (Data *)buf._0_8_;
        (this->serialNumber).d.ptr = (char16_t *)buf._8_8_;
        qVar25 = (this->serialNumber).d.size;
        (this->serialNumber).d.size = buf._16_8_;
        buf._0_8_ = pDVar26;
        buf._8_8_ = pcVar18;
      }
      else if (qVar2 == 0xfe) {
        parseEdidString((QString *)buf,this_00,data);
        pDVar26 = (this->identifier).d.d;
        pcVar18 = (this->identifier).d.ptr;
        (this->identifier).d.d = (Data *)buf._0_8_;
        (this->identifier).d.ptr = (char16_t *)buf._8_8_;
        qVar25 = (this->identifier).d.size;
        (this->identifier).d.size = buf._16_8_;
        buf._0_8_ = pDVar26;
        buf._8_8_ = pcVar18;
      }
      else {
        if (qVar2 != 0xfc) goto LAB_005c1d19;
        parseEdidString((QString *)buf,this_00,data);
        pDVar26 = (this->model).d.d;
        pcVar18 = (this->model).d.ptr;
        (this->model).d.d = (Data *)buf._0_8_;
        (this->model).d.ptr = (char16_t *)buf._8_8_;
        qVar25 = (this->model).d.size;
        (this->model).d.size = buf._16_8_;
        buf._0_8_ = pDVar26;
        buf._8_8_ = pcVar18;
      }
      buf._16_8_ = qVar25;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buf);
    }
LAB_005c1d19:
    data = data + 0x12;
  }
  local_250.m_size = QByteArrayView::lengthHelperCharArray((char *)&local_23b,3);
  local_2c8.d = (Data *)0x0;
  local_2c8.ptr = (char16_t *)0x0;
  local_2c8.size = 0;
  local_268.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_268.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_268.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  latin1.m_data = "/usr/share/hwdata/pnp.ids";
  latin1.m_size = 0x19;
  local_250.m_data = (storage_type *)&local_23b;
  QString::QString((QString *)&local_268,latin1);
  local_278 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_270 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_278,(QString *)&local_268);
  cVar23 = QFile::open((QFile *)&local_278,1);
  if (cVar23 != '\0') {
    memset((QArrayDataPointer<char16_t> *)buf,0xaa,0x200);
    do {
      do {
        cVar23 = QFileDevice::atEnd();
        if (((cVar23 != '\0') ||
            (lVar34 = QIODevice::readLine((char *)&local_278,(longlong)buf), lVar34 < 0)) ||
           (lVar34 == 0x200)) goto LAB_005c1ebc;
        local_288.m_size = lVar34 + -1;
        local_288.m_data = (storage_type *)buf;
      } while (((((undefined1 *)local_288.m_size == (undefined1 *)0x0) || (buf[0] == '#')) ||
               (pDVar26 = (Data *)QByteArrayView::indexOf(&local_288,'\t',0), (long)pDVar26 < 1)) ||
              (puVar1 = (undefined1 *)
                        ((long)&(pDVar26->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                                _M_i + 1), puVar1 == (undefined1 *)local_288.m_size));
      local_2a8.ptr = (char16_t *)local_288.m_data;
      local_2a8.d = pDVar26;
      bVar36 = ::comparesEqual((QByteArrayView *)&local_2a8,&local_250);
    } while (!bVar36);
    QString::fromUtf8((QString *)&local_2a8,puVar1 + (long)(Data **)local_288.m_data,
                      local_288.m_size - (long)puVar1);
    local_2c8.ptr = local_2a8.ptr;
    local_2c8.d = local_2a8.d;
    local_2a8.d = (Data *)0x0;
    local_2a8.ptr = (char16_t *)0x0;
    local_2c8.size = local_2a8.size;
    local_2a8.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a8);
  }
LAB_005c1ebc:
  QFile::~QFile((QFile *)&local_278);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_268);
  pDVar26 = (this->manufacturer).d.d;
  pcVar18 = (this->manufacturer).d.ptr;
  (this->manufacturer).d.d = local_2c8.d;
  (this->manufacturer).d.ptr = local_2c8.ptr;
  qVar25 = (this->manufacturer).d.size;
  (this->manufacturer).d.size = local_2c8.size;
  local_2c8.d = pDVar26;
  local_2c8.ptr = pcVar18;
  local_2c8.size = qVar25;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
  if ((this->manufacturer).d.size == 0) {
    __s1 = q_edidVendorIds;
    uVar31 = 0x9fb;
    while (uVar33 = uVar31, 0 < (long)uVar33) {
      uVar31 = uVar33 >> 1;
      iVar24 = strncmp(__s1[uVar31].id,(char *)&local_23b,3);
      if (iVar24 < 0) {
        __s1 = __s1 + uVar31 + 1;
        uVar31 = ~uVar31 + uVar33;
      }
    }
    if ((__s1 != (QEdidVendorId *)&DAT_006203ac) &&
       (iVar24 = strncmp(__s1->id,(char *)&local_23b,3), iVar24 == 0)) {
      local_268.d = (Data *)("Avolites Ltd" +
                            *(ushort *)
                             ((long)q_edidVendorNamesOffsets + ((long)(__s1 + -0x1876f0) >> 1)));
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_2d8,(char **)&local_268);
      QVar46.m_data = (storage_type *)local_2d8.m_size;
      QVar46.m_size = (qsizetype)buf;
      QString::fromUtf8(QVar46);
      pDVar26 = (this->manufacturer).d.d;
      pcVar18 = (this->manufacturer).d.ptr;
      (this->manufacturer).d.d = (Data *)buf._0_8_;
      (this->manufacturer).d.ptr = (char16_t *)buf._8_8_;
      qVar25 = (this->manufacturer).d.size;
      (this->manufacturer).d.size = buf._16_8_;
      buf._0_8_ = pDVar26;
      buf._8_8_ = pcVar18;
      buf._16_8_ = qVar25;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buf);
      if ((this->manufacturer).d.size != 0) goto LAB_005c1fcf;
    }
    QVar45.m_data = (storage_type *)0x3;
    QVar45.m_size = (qsizetype)buf;
    QString::fromUtf8(QVar45);
    pDVar26 = (this->manufacturer).d.d;
    pcVar18 = (this->manufacturer).d.ptr;
    (this->manufacturer).d.d = (Data *)buf._0_8_;
    (this->manufacturer).d.ptr = (char16_t *)buf._8_8_;
    qVar25 = (this->manufacturer).d.size;
    (this->manufacturer).d.size = buf._16_8_;
    buf._0_8_ = pDVar26;
    buf._8_8_ = pcVar18;
    buf._16_8_ = qVar25;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buf);
  }
LAB_005c1fcf:
  uVar5 = *(ushort *)(pcVar30 + 0x15);
  (this->physicalSize).wd = (double)(uVar5 & 0xff) * 10.0;
  (this->physicalSize).ht = (double)(byte)(uVar5 >> 8) * 10.0;
  bVar3 = pcVar30[0x17];
  qVar37 = 0.0;
  if (bVar3 != 0xff) {
    qVar37 = (double)((float)bVar3 / 100.0) + 1.0;
  }
  this->gamma = qVar37;
  this->useTables = bVar3 == 0xff;
  this->sRgb = (bool)((byte)pcVar30[0x18] >> 2 & 1);
  bVar3 = pcVar30[0x19];
  bVar4 = pcVar30[0x1a];
  auVar38 = psllw(ZEXT316(CONCAT12((char)((ushort)*(undefined2 *)(pcVar30 + 0x1b) >> 8),
                                   *(undefined2 *)(pcVar30 + 0x1b)) & 0xff00ff),2);
  auVar39._8_6_ = 0;
  auVar39._0_8_ = (ulong)(bVar3 >> 6) | (ulong)(bVar3 >> 4 & 3) << 0x10;
  auVar39 = auVar39 | auVar38._0_14_;
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar39._0_10_;
  auVar9._12_2_ = auVar39._6_2_;
  auVar14._8_2_ = auVar39._4_2_;
  auVar14._0_8_ = auVar39._0_8_;
  auVar14._10_4_ = auVar9._10_4_;
  auVar19._6_8_ = 0;
  auVar19._0_6_ = auVar14._8_6_;
  auVar40._8_6_ = 0;
  auVar40._0_8_ = (ulong)(bVar3 >> 2) | (ulong)bVar3 << 0x10;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (ulong)CONCAT12((char)((ushort)*(undefined2 *)(pcVar30 + 0x1d) >> 8),
                       *(undefined2 *)(pcVar30 + 0x1d)) & 0xffffffffffff00ff;
  auVar38 = psllw(auVar43,2);
  auVar42 = auVar38._0_14_ | auVar40 & DAT_0061dbb0._0_14_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (ulong)CONCAT12((char)((ushort)*(undefined2 *)(pcVar30 + 0x1f) >> 8),
                       *(undefined2 *)(pcVar30 + 0x1f)) & 0xffffffffffff00ff;
  auVar38 = psllw(auVar38,2);
  auVar44._8_6_ = 0;
  auVar44._0_8_ = (ulong)(bVar4 >> 6) | (ulong)(bVar4 >> 4 & 3) << 0x10;
  auVar44 = auVar44 | auVar38._0_14_;
  auVar7._10_2_ = 0;
  auVar7._0_10_ = auVar42._0_10_;
  auVar7._12_2_ = auVar42._6_2_;
  auVar10._8_2_ = auVar42._4_2_;
  auVar10._0_8_ = auVar42._0_8_;
  auVar10._10_4_ = auVar7._10_4_;
  auVar20._6_8_ = 0;
  auVar20._0_6_ = auVar10._8_6_;
  auVar15._4_2_ = auVar42._2_2_;
  auVar15._0_4_ = auVar42._0_4_;
  auVar15._6_8_ = SUB148(auVar20 << 0x40,6);
  auVar8._10_2_ = 0;
  auVar8._0_10_ = auVar44._0_10_;
  auVar8._12_2_ = auVar44._6_2_;
  auVar11._8_2_ = auVar44._4_2_;
  auVar11._0_8_ = auVar44._0_8_;
  auVar11._10_4_ = auVar8._10_4_;
  auVar21._6_8_ = 0;
  auVar21._0_6_ = auVar11._8_6_;
  auVar16._4_2_ = auVar44._2_2_;
  auVar16._0_4_ = auVar44._0_4_;
  auVar16._6_8_ = SUB148(auVar21 << 0x40,6);
  auVar13._8_6_ = 0;
  auVar13._0_8_ = (ulong)(bVar4 >> 2) | (ulong)bVar4 << 0x10;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (ulong)CONCAT12((char)((ushort)*(undefined2 *)(pcVar30 + 0x21) >> 8),
                       *(undefined2 *)(pcVar30 + 0x21)) & 0xffffffffffff00ff;
  auVar38 = psllw(auVar41,2);
  auVar40 = auVar38._0_14_ | auVar13 & DAT_0061dbb0._0_14_;
  (this->redChromaticity).xp = (double)((float)auVar39._0_2_ * 0.0009765625);
  (this->redChromaticity).yp =
       (double)((float)(int)CONCAT82(SUB148(auVar19 << 0x40,6),auVar39._2_2_) * 0.0009765625);
  (this->greenChromaticity).xp = (double)((float)(auVar42._0_4_ & 0xffff) * 0.0009765625);
  (this->greenChromaticity).yp = (double)((float)auVar15._4_4_ * 0.0009765625);
  (this->blueChromaticity).xp = (double)((float)(auVar44._0_4_ & 0xffff) * 0.0009765625);
  (this->blueChromaticity).yp = (double)((float)auVar16._4_4_ * 0.0009765625);
  auVar42._10_2_ = 0;
  auVar42._0_10_ = auVar40._0_10_;
  auVar42._12_2_ = auVar40._6_2_;
  auVar12._8_2_ = auVar40._4_2_;
  auVar12._0_8_ = auVar40._0_8_;
  auVar12._10_4_ = auVar42._10_4_;
  auVar22._6_8_ = 0;
  auVar22._0_6_ = auVar12._8_6_;
  auVar17._4_2_ = auVar40._2_2_;
  auVar17._0_4_ = auVar40._0_4_;
  auVar17._6_8_ = SUB148(auVar22 << 0x40,6);
  (this->whiteChromaticity).xp = (double)((float)(auVar40._0_4_ & 0xffff) * 0.0009765625);
  (this->whiteChromaticity).yp = (double)((float)auVar17._4_4_ * 0.0009765625);
  uVar29 = uVar29 >> 7;
  this_01 = &this->tables;
  uVar31 = 1;
  while( true ) {
    bVar36 = uVar29 <= uVar31;
    if (uVar29 <= uVar31) break;
    uVar28 = (int)uVar31 << 7;
    if (pcVar30[uVar28] == '@') {
      uVar32 = (byte)pcVar30[(ulong)uVar28 + 0x51] & 0x3f;
      uVar33 = (ulong)uVar32;
      uVar28 = (byte)pcVar30[(ulong)uVar28 + 0x51] & 0xffffffc0;
      if (uVar28 == 0x80) {
        if (0xf < (byte)uVar32) break;
        buf[0x10] = '\0';
        buf[0x11] = '\0';
        buf[0x12] = '\0';
        buf[0x13] = '\0';
        buf[0x14] = '\0';
        buf[0x15] = '\0';
        buf[0x16] = '\0';
        buf[0x17] = '\0';
        local_268.size = 0;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf[8] = '\0';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        local_2a8.size = 0;
        local_268.d = (Data *)0x0;
        local_268.ptr = (char16_t *)0x0;
        local_2a8.d = (Data *)0x0;
        local_2a8.ptr = (char16_t *)0x0;
        uVar35 = (ulong)(uVar32 + 1);
        QList<unsigned_short>::reserve((QList<unsigned_short> *)&local_2a8,uVar35);
        QList<unsigned_short>::reserve((QList<unsigned_short> *)&local_268,uVar35);
        QList<unsigned_short>::reserve((QList<unsigned_short> *)buf,uVar35);
        for (uVar35 = 0; uVar33 != uVar35; uVar35 = uVar35 + 1) {
          bVar3 = pcVar30[uVar35 + 0x52];
          puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)&local_2a8);
          puVar27[uVar35] = (ushort)bVar3 * 0x101;
        }
        puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)&local_2a8);
        puVar27[uVar33] = 0xffff;
        for (uVar35 = 0; uVar33 != uVar35; uVar35 = uVar35 + 1) {
          bVar3 = pcVar30[uVar35 + 0x61];
          puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)&local_268);
          puVar27[uVar35] = (ushort)bVar3 * 0x101;
        }
        puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)&local_268);
        puVar27[uVar33] = 0xffff;
        for (uVar35 = 0; uVar33 != uVar35; uVar35 = uVar35 + 1) {
          bVar3 = pcVar30[uVar35 + 0x70];
          puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)buf);
          puVar27[uVar35] = (ushort)bVar3 * 0x101;
        }
        puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)buf);
        puVar27[uVar33] = 0xffff;
        QList<QList<unsigned_short>>::emplaceBack<QList<unsigned_short>const&>
                  ((QList<QList<unsigned_short>> *)this_01,(QList<unsigned_short> *)buf);
        QList<QList<unsigned_short>>::emplaceBack<QList<unsigned_short>const&>
                  ((QList<QList<unsigned_short>> *)this_01,(QList<unsigned_short> *)&local_268);
        QList<QList<unsigned_short>>::emplaceBack<QList<unsigned_short>const&>
                  ((QList<QList<unsigned_short>> *)this_01,(QList<unsigned_short> *)&local_2a8);
        QArrayDataPointer<unsigned_short>::~QArrayDataPointer
                  ((QArrayDataPointer<unsigned_short> *)&local_2a8);
        QArrayDataPointer<unsigned_short>::~QArrayDataPointer
                  ((QArrayDataPointer<unsigned_short> *)&local_268);
      }
      else {
        if (uVar28 != 0x40) goto LAB_005c237b;
        if (0x2d < (byte)uVar32) break;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf[8] = '\0';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        buf[0x10] = '\0';
        buf[0x11] = '\0';
        buf[0x12] = '\0';
        buf[0x13] = '\0';
        buf[0x14] = '\0';
        buf[0x15] = '\0';
        buf[0x16] = '\0';
        buf[0x17] = '\0';
        QList<unsigned_short>::reserve((QList<unsigned_short> *)buf,uVar33 + 1);
        for (uVar35 = 0; uVar33 != uVar35; uVar35 = uVar35 + 1) {
          bVar3 = pcVar30[uVar35 + 0x52];
          puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)buf);
          puVar27[uVar35] = (ushort)bVar3 * 0x101;
        }
        puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)buf);
        puVar27[uVar33] = 0xffff;
        QList<QList<unsigned_short>>::emplaceBack<QList<unsigned_short>const&>
                  ((QList<QList<unsigned_short>> *)this_01,(QList<unsigned_short> *)buf);
      }
      QArrayDataPointer<unsigned_short>::~QArrayDataPointer
                ((QArrayDataPointer<unsigned_short> *)buf);
    }
LAB_005c237b:
    uVar31 = (ulong)((int)uVar31 + 1);
  }
LAB_005c1b0a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return bVar36;
}

Assistant:

bool QEdidParser::parse(const QByteArray &blob)
{
    const quint8 *data = reinterpret_cast<const quint8 *>(blob.constData());
    const size_t length = blob.size();

    // Verify header
    if (length < 128)
        return false;
    if (data[0] != 0x00 || data[1] != 0xff)
        return false;

    /* Decode the PNP ID from three 5 bit words packed into 2 bytes
     * /--08--\/--09--\
     * 7654321076543210
     * |\---/\---/\---/
     * R  C1   C2   C3 */
    char pnpId[3];
    pnpId[0] = 'A' + ((data[EDID_OFFSET_PNP_ID] & 0x7c) / 4) - 1;
    pnpId[1] = 'A' + ((data[EDID_OFFSET_PNP_ID] & 0x3) * 8) + ((data[EDID_OFFSET_PNP_ID + 1] & 0xe0) / 32) - 1;
    pnpId[2] = 'A' + (data[EDID_OFFSET_PNP_ID + 1] & 0x1f) - 1;

    // Clear manufacturer
    manufacturer = QString();

    // Serial number, will be overwritten by an ASCII descriptor
    // when and if it will be found
    quint32 serial = data[EDID_OFFSET_SERIAL]
            + (data[EDID_OFFSET_SERIAL + 1] << 8)
            + (data[EDID_OFFSET_SERIAL + 2] << 16)
            + (data[EDID_OFFSET_SERIAL + 3] << 24);
    if (serial > 0)
        serialNumber = QString::number(serial);
    else
        serialNumber = QString();

    // Parse EDID data
    for (int i = 0; i < EDID_DATA_BLOCK_COUNT; ++i) {
        const uint offset = EDID_OFFSET_DATA_BLOCKS + i * 18;

        if (data[offset] != 0 || data[offset + 1] != 0 || data[offset + 2] != 0)
            continue;

        if (data[offset + 3] == EDID_DESCRIPTOR_PRODUCT_NAME)
            model = parseEdidString(&data[offset + 5]);
        else if (data[offset + 3] == EDID_DESCRIPTOR_ALPHANUMERIC_STRING)
            identifier = parseEdidString(&data[offset + 5]);
        else if (data[offset + 3] == EDID_DESCRIPTOR_SERIAL_NUMBER)
            serialNumber = parseEdidString(&data[offset + 5]);
    }

    // Try to use cache first because it is potentially more updated
    manufacturer = lookupVendorIdInSystemDatabase(pnpId);

    if (manufacturer.isEmpty()) {
        // Find the manufacturer from the vendor lookup table
        const auto compareVendorId = [](const QEdidVendorId &vendor, const char *str)
        {
            return strncmp(vendor.id, str, 3) < 0;
        };

        const auto b = std::begin(q_edidVendorIds);
        const auto e = std::end(q_edidVendorIds);
        auto it = std::lower_bound(b,
                                   e,
                                   pnpId,
                                   compareVendorId);

        if (it != e && strncmp(it->id, pnpId, 3) == 0)
            manufacturer = QString::fromUtf8(q_edidVendorNames + q_edidVendorNamesOffsets[it - b]);
    }

    // If we don't know the manufacturer, fallback to PNP ID
    if (manufacturer.isEmpty())
        manufacturer = QString::fromUtf8(pnpId, std::size(pnpId));

    // Physical size
    physicalSize = QSizeF(data[EDID_PHYSICAL_WIDTH], data[EDID_OFFSET_PHYSICAL_HEIGHT]) * 10;

    // Gamma and transfer function
    const uint igamma = data[EDID_TRANSFER_FUNCTION];
    if (igamma != 0xff) {
        gamma = 1.0 + (igamma / 100.0f);
        useTables = false;
    } else {
        gamma = 0.0; // Defined in DI-EXT
        useTables = true;
    }
    sRgb = data[EDID_FEATURE_SUPPORT] & 0x04;

    // Chromaticities
    int rx = (data[EDID_CHROMATICITIES_BLOCK] >> 6) & 0x03;
    int ry = (data[EDID_CHROMATICITIES_BLOCK] >> 4) & 0x03;
    int gx = (data[EDID_CHROMATICITIES_BLOCK] >> 2) & 0x03;
    int gy = (data[EDID_CHROMATICITIES_BLOCK] >> 0) & 0x03;
    int bx = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 6) & 0x03;
    int by = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 4) & 0x03;
    int wx = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 2) & 0x03;
    int wy = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 0) & 0x03;
    rx |= data[EDID_CHROMATICITIES_BLOCK + 2] << 2;
    ry |= data[EDID_CHROMATICITIES_BLOCK + 3] << 2;
    gx |= data[EDID_CHROMATICITIES_BLOCK + 4] << 2;
    gy |= data[EDID_CHROMATICITIES_BLOCK + 5] << 2;
    bx |= data[EDID_CHROMATICITIES_BLOCK + 6] << 2;
    by |= data[EDID_CHROMATICITIES_BLOCK + 7] << 2;
    wx |= data[EDID_CHROMATICITIES_BLOCK + 8] << 2;
    wy |= data[EDID_CHROMATICITIES_BLOCK + 9] << 2;

    redChromaticity.setX(rx * (1.0f / 1024.0f));
    redChromaticity.setY(ry * (1.0f / 1024.0f));
    greenChromaticity.setX(gx * (1.0f / 1024.0f));
    greenChromaticity.setY(gy * (1.0f / 1024.0f));
    blueChromaticity.setX(bx * (1.0f / 1024.0f));
    blueChromaticity.setY(by * (1.0f / 1024.0f));
    whiteChromaticity.setX(wx * (1.0f / 1024.0f));
    whiteChromaticity.setY(wy * (1.0f / 1024.0f));

    // Find extensions
    for (uint i = 1; i < length / 128; ++i) {
        uint extensionId = data[i * 128];
        if (extensionId == 0x40) { // DI-EXT
            // 0x0E (sub-pixel layout)
            // 0x20->0x22 (bits per color)
            // 0x51->0x7e Transfer characteristics
            const uchar desc = data[i * 128 + 0x51];
            const uchar len = desc & 0x3f;
            if ((desc & 0xc0) == 0x40) {
                if (len > 45)
                    return false;
                QList<uint16_t> whiteTRC;
                whiteTRC.reserve(len + 1);
                for (uint j = 0; j < len; ++j)
                    whiteTRC[j] = data[0x52 + j] * 0x101;
                whiteTRC[len] = 0xffff;
                tables.append(whiteTRC);
            } else if ((desc & 0xc0) == 0x80) {
                if (len > 15)
                    return false;
                QList<uint16_t> redTRC;
                QList<uint16_t> greenTRC;
                QList<uint16_t> blueTRC;
                blueTRC.reserve(len + 1);
                greenTRC.reserve(len + 1);
                redTRC.reserve(len + 1);
                for (uint j = 0; j < len; ++j)
                    blueTRC[j] = data[0x52 + j] * 0x101;
                blueTRC[len] = 0xffff;
                for (uint j = 0; j < len; ++j)
                    greenTRC[j] = data[0x61 + j] * 0x101;
                greenTRC[len] = 0xffff;
                for (uint j = 0; j < len; ++j)
                    redTRC[j] = data[0x70 + j] * 0x101;
                redTRC[len] = 0xffff;
                tables.append(redTRC);
                tables.append(greenTRC);
                tables.append(blueTRC);
            }
        }
    }

    return true;
}